

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

void __thiscall Potassco::AspifOutput::acycEdge(AspifOutput *this,int s,int t,LitSpan *cond)

{
  AspifOutput *in_RCX;
  Directive_t in_ESI;
  LitSpan *in_RDI;
  AspifOutput *unaff_retaddr;
  int x;
  AspifOutput *in_stack_ffffffffffffffe0;
  LitSpan *lits;
  
  lits = in_RDI;
  Directive_t::Directive_t((Directive_t *)&stack0xffffffffffffffe4,Edge);
  x = (int)((ulong)in_RDI >> 0x20);
  startDir(in_RCX,in_ESI);
  add(in_stack_ffffffffffffffe0,x);
  add(in_stack_ffffffffffffffe0,x);
  add(unaff_retaddr,lits);
  endDir(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

void AspifOutput::acycEdge(int s, int t, const LitSpan& cond) {
	startDir(Directive_t::Edge).add(s).add(t).add(cond).endDir();
}